

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint lodepng_load_file(uchar **out,size_t *outsize,char *filename)

{
  int iVar1;
  FILE *pFVar2;
  uchar *__ptr;
  size_t sVar3;
  uint uVar4;
  size_t __size;
  
  pFVar2 = fopen(filename,"rb");
  uVar4 = 0x4e;
  if (pFVar2 != (FILE *)0x0) {
    iVar1 = fseek(pFVar2,0,2);
    if (iVar1 == 0) {
      sVar3 = ftell(pFVar2);
      __size = 0xffffffffffffffff;
      if (sVar3 != 0x7fffffffffffffff) {
        __size = sVar3;
      }
    }
    else {
      __size = 0xffffffffffffffff;
    }
    fclose(pFVar2);
    if (-1 < (long)__size) {
      *outsize = __size;
      __ptr = (uchar *)malloc(__size);
      *out = __ptr;
      if (__size == 0 || __ptr != (uchar *)0x0) {
        pFVar2 = fopen(filename,"rb");
        if (pFVar2 != (FILE *)0x0) {
          sVar3 = fread(__ptr,1,__size,pFVar2);
          fclose(pFVar2);
          uVar4 = 0x4e;
          if (sVar3 == __size) {
            uVar4 = 0;
          }
        }
      }
      else {
        uVar4 = 0x53;
      }
    }
  }
  return uVar4;
}

Assistant:

unsigned lodepng_load_file(unsigned char** out, size_t* outsize, const char* filename) {
  long size = lodepng_filesize(filename);
  if(size < 0) return 78;
  *outsize = (size_t)size;

  *out = (unsigned char*)lodepng_malloc((size_t)size);
  if(!(*out) && size > 0) return 83; /*the above malloc failed*/

  return lodepng_buffer_file(*out, (size_t)size, filename);
}